

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedentity.cpp
# Opt level: O2

bool __thiscall libcellml::NamedEntity::doEquals(NamedEntity *this,EntityPtr *other)

{
  EntityImpl *pEVar1;
  bool bVar2;
  byte unaff_BPL;
  shared_ptr<libcellml::NamedEntity> namedEntity;
  shared_ptr<libcellml::Entity> local_50;
  string local_40;
  
  bVar2 = Entity::doEquals((Entity *)this,other);
  if (bVar2) {
    std::dynamic_pointer_cast<libcellml::NamedEntity,libcellml::Entity>(&local_50);
    if (local_50.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pEVar1 = (this->super_ParentedEntity).super_Entity.mPimpl;
      name_abi_cxx11_(&local_40,
                      (NamedEntity *)
                      local_50.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
      unaff_BPL = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&pEVar1[1].mId.field_2,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (local_50.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) goto LAB_001f75f9;
  }
  unaff_BPL = 0;
LAB_001f75f9:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool NamedEntity::doEquals(const EntityPtr &other) const
{
    if (Entity::doEquals(other)) {
        auto namedEntity = std::dynamic_pointer_cast<NamedEntity>(other);
        if (namedEntity != nullptr) {
            return pFunc()->mName == namedEntity->name();
        }
    }
    return false;
}